

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

CatalogEntryLookup * __thiscall
duckdb::Catalog::TryLookupEntryInternal
          (CatalogEntryLookup *__return_storage_ptr__,Catalog *this,CatalogTransaction transaction,
          string *schema,EntryLookupInfo *lookup_info)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EntryLookupInfo schema_lookup;
  BinderException local_60;
  _Alloc_hider local_50;
  char local_40 [16];
  
  if (((lookup_info->at_clause).ptr != (BoundAtClause *)0x0) &&
     (iVar1 = (*this->_vptr_Catalog[0x17])(this), (char)iVar1 == '\0')) {
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
    (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
    local_50._M_p = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Catalog type does not support time travel","");
    BinderException::BinderException(&local_60,(string *)&local_50);
    ErrorData::ErrorData(&__return_storage_ptr__->error,(exception *)&local_60);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_60);
    if (local_50._M_p == local_40) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50._M_p);
    return __return_storage_ptr__;
  }
  EntryLookupInfo::EntryLookupInfo
            ((EntryLookupInfo *)&local_50,SCHEMA_ENTRY,schema,(lookup_info->at_clause).ptr,
             (QueryErrorContext)(lookup_info->error_context).query_location.index);
  iVar1 = (*this->_vptr_Catalog[8])(this,(EntryLookupInfo *)&local_50,1);
  local_60.super_Exception._0_8_ = CONCAT44(extraout_var,iVar1);
  if ((SchemaCatalogEntry *)local_60.super_Exception._0_8_ == (SchemaCatalogEntry *)0x0) {
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
    (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
  }
  else {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)&local_60);
    iVar1 = (*(((InCatalogEntry *)local_60.super_Exception._0_8_)->super_CatalogEntry).
              _vptr_CatalogEntry[0x1c])(local_60.super_Exception._0_8_,lookup_info);
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)local_60.super_Exception._0_8_;
    if ((CatalogEntry *)CONCAT44(extraout_var_00,iVar1) == (CatalogEntry *)0x0) {
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
    }
    else {
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  ErrorData::ErrorData(&__return_storage_ptr__->error);
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntryInternal(CatalogTransaction transaction, const string &schema,
                                                   const EntryLookupInfo &lookup_info) {
	if (lookup_info.GetAtClause() && !SupportsTimeTravel()) {
		return {nullptr, nullptr, ErrorData(BinderException("Catalog type does not support time travel"))};
	}
	auto schema_lookup = EntryLookupInfo::SchemaLookup(lookup_info, schema);
	auto schema_entry = LookupSchema(transaction, schema_lookup, OnEntryNotFound::RETURN_NULL);
	if (!schema_entry) {
		return {nullptr, nullptr, ErrorData()};
	}
	auto entry = schema_entry->LookupEntry(transaction, lookup_info);
	if (!entry) {
		return {schema_entry, nullptr, ErrorData()};
	}
	return {schema_entry, entry, ErrorData()};
}